

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O2

void __thiscall CMeshClosestPointMapper::TcSeamlessPatch::~TcSeamlessPatch(TcSeamlessPatch *this)

{
  ~TcSeamlessPatch(this);
  operator_delete(this,0x1e8);
  return;
}

Assistant:

void Create(int fi, int steps)
    {
      m_fis.reserve(25);
      Expand(fi, 0);
      for (int step = 1; step <= steps; step++)
      {
        std::vector<int> stepFis = m_nextStepFis;
        m_nextStepFis.clear();
        for (int nfi : stepFis)
        {
          Expand(nfi, step);
        }
      }
    }